

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O2

void fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
               (uint64_t *out1,fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 arg1,uint64_t *arg2,
               uint64_t *arg3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  undefined7 in_register_00000031;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar7 = -(ulong)((int)CONCAT71(in_register_00000031,arg1) != 0);
  uVar8 = ~uVar7;
  auVar9._8_4_ = (int)uVar7;
  auVar9._0_8_ = uVar7;
  auVar9._12_4_ = (int)(uVar7 >> 0x20);
  auVar1 = *(undefined1 (*) [16])(arg3 + 2);
  auVar2 = *(undefined1 (*) [16])(arg3 + 4);
  auVar3 = *(undefined1 (*) [16])(arg3 + 6);
  auVar10._8_4_ = (int)uVar8;
  auVar10._0_8_ = uVar8;
  auVar10._12_4_ = (int)(uVar8 >> 0x20);
  auVar4 = *(undefined1 (*) [16])(arg2 + 2);
  auVar5 = *(undefined1 (*) [16])(arg2 + 4);
  auVar6 = *(undefined1 (*) [16])(arg2 + 6);
  *(undefined1 (*) [16])out1 =
       *(undefined1 (*) [16])arg2 & auVar10 | *(undefined1 (*) [16])arg3 & auVar9;
  *(undefined1 (*) [16])(out1 + 2) = auVar4 & auVar10 | auVar1 & auVar9;
  *(undefined1 (*) [16])(out1 + 4) = auVar5 & auVar10 | auVar2 & auVar9;
  *(undefined1 (*) [16])(out1 + 6) = auVar6 & auVar10 | auVar3 & auVar9;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(
    uint64_t *out1, fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 arg1,
    uint64_t arg2, uint64_t arg3) {
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x1;
    uint64_t x2;
    uint64_t x3;
    x1 = (!(!arg1));
    x2 = ((fiat_id_tc26_gost_3410_2012_512_paramSetB_int1)(0x0 - x1) &
          UINT64_C(0xffffffffffffffff));
    x3 = ((fiat_id_tc26_gost_3410_2012_512_paramSetB_value_barrier_u64(x2) &
           arg3) |
          (fiat_id_tc26_gost_3410_2012_512_paramSetB_value_barrier_u64((~x2)) &
           arg2));
    *out1 = x3;
}